

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

Ref<embree::SceneGraph::PerspectiveCameraNode> __thiscall
embree::TutorialScene::getCamera(TutorialScene *this,string *name)

{
  pointer pcVar1;
  pointer __s2;
  PerspectiveCameraNode *__n;
  pointer pRVar2;
  int iVar3;
  runtime_error *this_00;
  long *plVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long lVar6;
  long lVar7;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  lVar7 = name->_M_string_length - (long)pcVar1;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 3;
    __s2 = (in_RDX->_M_dataplus)._M_p;
    __n = (PerspectiveCameraNode *)in_RDX->_M_string_length;
    lVar6 = 0;
    do {
      pRVar2 = *(pointer *)(pcVar1 + lVar6 * 8);
      if (pRVar2[7].ptr == __n) {
        if (__n == (PerspectiveCameraNode *)0x0) {
LAB_0013cbe6:
          (this->cameras).
          super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pRVar2;
          (*(code *)(pRVar2->ptr->super_Node).fileName._M_dataplus._M_p)(pRVar2);
          return (Ref<embree::SceneGraph::PerspectiveCameraNode>)(PerspectiveCameraNode *)this;
        }
        iVar3 = bcmp(pRVar2[6].ptr,__s2,(size_t)__n);
        if (iVar3 == 0) goto LAB_0013cbe6;
      }
      lVar6 = lVar6 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar6);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"camera \"",in_RDX);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70 = (long *)*plVar4;
  plVar5 = plVar4 + 2;
  if (local_70 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_70);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<SceneGraph::PerspectiveCameraNode> TutorialScene::getCamera(const std::string& name)
  {
    for (size_t i=0; i<cameras.size(); i++)
      if (cameras[i]->name == name) return cameras[i];
    
    THROW_RUNTIME_ERROR("camera \"" + name +"\" not found");
  }